

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogf_tools.cxx
# Opt level: O2

void __thiscall ogf_tools::process(ogf_tools *this,cl_parser *cl)

{
  char *pcVar1;
  bool bVar2;
  target_format tVar3;
  int iVar4;
  xr_ogf *object;
  long lVar5;
  size_t sVar6;
  allocator<char> local_71;
  object_tools *local_70;
  xr_sg_type local_68;
  uint local_64;
  ulong local_60;
  char *sg_val;
  string local_50;
  
  local_70 = &this->super_object_tools;
  tVar3 = object_tools::get_target_format(&this->super_object_tools,cl);
  if ((tVar3 != TARGET_ERROR) && (tVar3 != TARGET_INFO)) {
    sg_val = (char *)0x0;
    bVar2 = cl_parser::get_string(cl,"-sg",&sg_val);
    pcVar1 = sg_val;
    local_68 = SOC;
    if ((bVar2) && (iVar4 = strcmp(sg_val,"soc"), iVar4 != 0)) {
      iVar4 = strcmp(pcVar1,"cscop");
      if (iVar4 != 0) {
        xray_re::msg("invalid `-sg` param");
        return;
      }
      local_68 = CSCOP;
    }
    bVar2 = batch_helper::prepare_target_name(&local_70->super_batch_helper,cl);
    if (bVar2) {
      local_64 = tVar3 >> 1 | (uint)((tVar3 & TARGET_INFO) != TARGET_DEFAULT) << 0x1f;
      sVar6 = cl->m_num_params;
      lVar5 = -0x18;
      local_60 = (ulong)local_64;
      while (bVar2 = sVar6 != 0, sVar6 = sVar6 - 1, bVar2) {
        pcVar1 = *(char **)((long)&cl->m_options[cl->m_argc].name + lVar5);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_71);
        object = xray_re::xr_ogf::load_ogf(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (object == (xr_ogf *)0x0) {
          xray_re::msg("can\'t load %s",pcVar1);
        }
        else {
          if (local_64 < 9) {
            switch((long)&switchD_00144e4b::switchdataD_001cab30 +
                   (long)(int)(&switchD_00144e4b::switchdataD_001cab30)[local_60]) {
            case 0x144e4d:
              object_tools::save_object(local_70,&object->super_xr_object,pcVar1,local_68);
              break;
            case 0x144e76:
              object_tools::save_skl(local_70,&object->super_xr_object,pcVar1,cl);
              break;
            case 0x144e8b:
              if ((object->super_xr_object).m_motions.
                  super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (object->super_xr_object).m_motions.
                  super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                xray_re::msg("object has no own motions");
              }
              else {
                object_tools::save_skls(local_70,&object->super_xr_object,pcVar1);
              }
              break;
            case 0x144ead:
              object_tools::save_bones(local_70,&object->super_xr_object,pcVar1);
            }
          }
          (*(object->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[1])(object);
        }
        lVar5 = lVar5 + -0x18;
      }
    }
    return;
  }
  xray_re::msg("unsupported options combination");
  return;
}

Assistant:

void ogf_tools::process(const cl_parser& cl)
{
	target_format format = get_target_format(cl);
	switch (format) {
	case TARGET_INFO:
	case TARGET_ERROR:
		msg("unsupported options combination");
		return;
	default:
		break;
	}

	xr_sg_type sg_type = xr_sg_type::SOC;
	const char* sg_val = 0;
	if (!cl.get_string("-sg", sg_val)) {
		sg_type = xr_sg_type::SOC;
	}
	else if (std::strcmp(sg_val, "soc") == 0) {
		sg_type = xr_sg_type::SOC;
	}
	else if (std::strcmp(sg_val, "cscop") == 0) {
		sg_type = xr_sg_type::CSCOP;
	}
	else {
		msg("invalid `-sg` param");
		return;
	}

	if (!prepare_target_name(cl))
		return;

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(i);
		xr_ogf* ogf = xr_ogf::load_ogf(source);
		if (ogf) {
			switch (format) {
			case TARGET_DEFAULT:
			case TARGET_OBJECT:
				save_object(*ogf, source, sg_type);
				break;
			case TARGET_SKLS:
				if (ogf->motions().empty()) {
					msg("object has no own motions");
				} else {
					save_skls(*ogf, source);
				}
				break;
			case TARGET_SKL:
				save_skl(*ogf, source, cl);
				break;
			case TARGET_BONES:
				save_bones(*ogf, source);
				break;
			default:
				break;
			}
		} else {
			msg("can't load %s", source);
		}
		delete ogf;
	}
}